

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::ClientContext::PendingQueryPreparedInternal
          (ClientContext *this,ClientContextLock *lock,string *query,
          shared_ptr<duckdb::PreparedStatementData,_true> *prepared,
          PendingQueryParameters *parameters)

{
  shared_ptr<duckdb::PreparedStatementData,_true> local_b8 [8];
  
  CleanupInternal((ClientContext *)lock,(ClientContextLock *)query,(BaseQueryResult *)0x0,false);
  LOCK();
  *(undefined1 *)&lock[4].client_guard._M_device = 0;
  UNLOCK();
  local_b8[0].internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  PendingStatementOrPreparedStatementInternal
            (this,lock,query,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             prepared,local_b8,parameters);
  if (local_b8[0].internal.
      super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (**(code **)(*(long *)local_b8[0].internal.
                          super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 8))();
  }
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> ClientContext::PendingQueryPreparedInternal(ClientContextLock &lock, const string &query,
                                                                           shared_ptr<PreparedStatementData> &prepared,
                                                                           const PendingQueryParameters &parameters) {
	try {
		InitialCleanup(lock);
	} catch (std::exception &ex) {
		return ErrorResult<PendingQueryResult>(ErrorData(ex), query);
	}
	return PendingStatementOrPreparedStatementInternal(lock, query, nullptr, prepared, parameters);
}